

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O0

UBool changesWhenNFKC_Casefolded(BinaryProperty *param_1,UChar32 c,UProperty param_3)

{
  UnicodeString *this;
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  Normalizer2Impl *ni;
  char16_t *src_00;
  bool local_131;
  UChar *srcArray;
  ReorderingBuffer buffer;
  undefined1 local_b0 [8];
  UnicodeString dest;
  UnicodeString src;
  Normalizer2Impl *kcf;
  UProperty local_20;
  UErrorCode errorCode;
  UProperty param_2_local;
  UChar32 c_local;
  BinaryProperty *param_0_local;
  
  kcf._4_4_ = U_ZERO_ERROR;
  local_20 = param_3;
  errorCode = c;
  _param_2_local = param_1;
  ni = icu_63::Normalizer2Factory::getNFKC_CFImpl((UErrorCode *)((long)&kcf + 4));
  UVar1 = U_FAILURE(kcf._4_4_);
  if (UVar1 == '\0') {
    icu_63::UnicodeString::UnicodeString((UnicodeString *)((long)&dest.fUnion + 0x30),errorCode);
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_b0);
    icu_63::ReorderingBuffer::ReorderingBuffer
              ((ReorderingBuffer *)&srcArray,ni,(UnicodeString *)local_b0);
    iVar2 = icu_63::ReorderingBuffer::init((ReorderingBuffer *)&srcArray,(EVP_PKEY_CTX *)0x5);
    if ((char)iVar2 != '\0') {
      this = (UnicodeString *)((long)&dest.fUnion + 0x30);
      src_00 = icu_63::UnicodeString::getBuffer(this);
      iVar3 = icu_63::UnicodeString::length(this);
      icu_63::Normalizer2Impl::compose
                (ni,src_00,src_00 + iVar3,'\0','\x01',(ReorderingBuffer *)&srcArray,
                 (UErrorCode *)((long)&kcf + 4));
    }
    icu_63::ReorderingBuffer::~ReorderingBuffer((ReorderingBuffer *)&srcArray);
    UVar1 = U_SUCCESS(kcf._4_4_);
    local_131 = false;
    if (UVar1 != '\0') {
      UVar1 = icu_63::UnicodeString::operator!=
                        ((UnicodeString *)local_b0,(UnicodeString *)((long)&dest.fUnion + 0x30));
      local_131 = UVar1 != '\0';
    }
    param_0_local._7_1_ = local_131;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b0);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&dest.fUnion + 0x30));
  }
  else {
    param_0_local._7_1_ = '\0';
  }
  return param_0_local._7_1_;
}

Assistant:

static UBool changesWhenNFKC_Casefolded(const BinaryProperty &/*prop*/, UChar32 c, UProperty /*which*/) {
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2Impl *kcf=Normalizer2Factory::getNFKC_CFImpl(errorCode);
    if(U_FAILURE(errorCode)) {
        return FALSE;
    }
    UnicodeString src(c);
    UnicodeString dest;
    {
        // The ReorderingBuffer must be in a block because its destructor
        // needs to release dest's buffer before we look at its contents.
        ReorderingBuffer buffer(*kcf, dest);
        // Small destCapacity for NFKC_CF(c).
        if(buffer.init(5, errorCode)) {
            const UChar *srcArray=src.getBuffer();
            kcf->compose(srcArray, srcArray+src.length(), FALSE,
                          TRUE, buffer, errorCode);
        }
    }
    return U_SUCCESS(errorCode) && dest!=src;
}